

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

void __thiscall
icu_63::UDataPathIterator::UDataPathIterator
          (UDataPathIterator *this,char *inPath,char *pkg,char *item,char *inSuffix,
          UBool doCheckLastFour,UErrorCode *pErrorCode)

{
  char *pcVar1;
  CharString *this_00;
  size_t sVar2;
  StringPiece s;
  StringPiece local_78;
  StringPiece local_68;
  undefined1 local_58 [3] [12];
  UBool local_31;
  char *pcStack_30;
  UBool doCheckLastFour_local;
  char *inSuffix_local;
  char *item_local;
  char *pkg_local;
  char *inPath_local;
  UDataPathIterator *this_local;
  
  local_31 = doCheckLastFour;
  pcStack_30 = inSuffix;
  inSuffix_local = item;
  item_local = pkg;
  pkg_local = inPath;
  inPath_local = (char *)this;
  StringPiece::StringPiece(&this->suffix);
  CharString::CharString(&this->itemPath);
  CharString::CharString(&this->pathBuffer);
  CharString::CharString(&this->packageStub);
  if (pkg_local == (char *)0x0) {
    pcVar1 = u_getDataDirectory_63();
    this->path = pcVar1;
  }
  else {
    this->path = pkg_local;
  }
  if (item_local != (char *)0x0) {
    this_00 = CharString::append(&this->packageStub,'/',pErrorCode);
    StringPiece::StringPiece((StringPiece *)local_58,item_local);
    s._12_4_ = 0;
    s.ptr_ = (char *)local_58[0]._0_8_;
    s.length_ = local_58[0]._8_4_;
    CharString::append(this_00,s,pErrorCode);
  }
  pcVar1 = findBasename(inSuffix_local);
  this->basename = pcVar1;
  sVar2 = strlen(this->basename);
  this->basenameLen = (uint32_t)sVar2;
  if (this->basename == inSuffix_local) {
    this->nextPath = this->path;
  }
  else {
    CharString::append(&this->itemPath,inSuffix_local,*(int *)&this->basename - (int)inSuffix_local,
                       pErrorCode);
    pcVar1 = CharString::data(&this->itemPath);
    this->nextPath = pcVar1;
  }
  if (pcStack_30 == (char *)0x0) {
    StringPiece::StringPiece(&local_78,"");
    (this->suffix).ptr_ = local_78.ptr_;
    (this->suffix).length_ = local_78.length_;
  }
  else {
    StringPiece::StringPiece(&local_68,pcStack_30);
    (this->suffix).ptr_ = local_68.ptr_;
    (this->suffix).length_ = local_68.length_;
  }
  this->checkLastFour = local_31;
  return;
}

Assistant:

UDataPathIterator::UDataPathIterator(const char *inPath, const char *pkg,
                                     const char *item, const char *inSuffix, UBool doCheckLastFour,
                                     UErrorCode *pErrorCode)
{
#ifdef UDATA_DEBUG
        fprintf(stderr, "SUFFIX1=%s PATH=%s\n", inSuffix, inPath);
#endif
    /** Path **/
    if(inPath == NULL) {
        path = u_getDataDirectory();
    } else {
        path = inPath;
    }

    /** Package **/
    if(pkg != NULL) {
      packageStub.append(U_FILE_SEP_CHAR, *pErrorCode).append(pkg, *pErrorCode);
#ifdef UDATA_DEBUG
      fprintf(stderr, "STUB=%s [%d]\n", packageStub.data(), packageStub.length());
#endif
    }

    /** Item **/
    basename = findBasename(item);
    basenameLen = (int32_t)uprv_strlen(basename);

    /** Item path **/
    if(basename == item) {
        nextPath = path;
    } else {
        itemPath.append(item, (int32_t)(basename-item), *pErrorCode);
        nextPath = itemPath.data();
    }
#ifdef UDATA_DEBUG
    fprintf(stderr, "SUFFIX=%s [%p]\n", inSuffix, inSuffix);
#endif

    /** Suffix  **/
    if(inSuffix != NULL) {
        suffix = inSuffix;
    } else {
        suffix = "";
    }

    checkLastFour = doCheckLastFour;

    /* pathBuffer will hold the output path strings returned by this iterator */

#ifdef UDATA_DEBUG
    fprintf(stderr, "%p: init %s -> [path=%s], [base=%s], [suff=%s], [itempath=%s], [nextpath=%s], [checklast4=%s]\n",
            iter,
            item,
            path,
            basename,
            suffix,
            itemPath.data(),
            nextPath,
            checkLastFour?"TRUE":"false");
#endif
}